

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
       *this,BinaryReader<mp::internal::IdentityConverter> *bound_reader)

{
  byte bVar1;
  NLHeader *pNVar2;
  BinaryReader<mp::internal::IdentityConverter> *pBVar3;
  byte *pbVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  undefined1 local_58 [16];
  ArgList local_40;
  
  bVar10 = bound_reader == (BinaryReader<mp::internal::IdentityConverter> *)0x0;
  pNVar2 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
LAB_001c17dc:
  while( true ) {
    pBVar3 = this->reader_;
    pbVar4 = (byte *)(pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = (char *)pbVar4;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = (char *)(pbVar4 + 1);
    bVar1 = *pbVar4;
    if (bVar1 < 0x62) break;
    if (bVar1 < 0x6b) {
      if (bVar1 == 0x62) {
        if (bVar10) {
          NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
          ::
          ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
                    ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                      *)this);
          bVar10 = false;
          if ((this->flags_ & 1) != 0) {
            return;
          }
        }
        else {
          if (bound_reader == (BinaryReader<mp::internal::IdentityConverter> *)0x0) {
            local_58 = (undefined1  [16])0x0;
            local_40.types_ = 0;
            local_40.field_1.values_ = (Value *)local_58;
            BinaryReaderBase::ReportError
                      (&pBVar3->super_BinaryReaderBase,(CStringRef)0x26348f,&local_40);
          }
          pcVar5 = (bound_reader->super_BinaryReaderBase).super_ReaderBase.ptr_;
          pcVar6 = (bound_reader->super_BinaryReaderBase).super_ReaderBase.start_;
          pcVar7 = (bound_reader->super_BinaryReaderBase).super_ReaderBase.token_;
          (pBVar3->super_BinaryReaderBase).super_ReaderBase.end_ =
               (bound_reader->super_BinaryReaderBase).super_ReaderBase.end_;
          (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar7;
          (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5;
          (pBVar3->super_BinaryReaderBase).super_ReaderBase.start_ = pcVar6;
          std::__cxx11::string::_M_assign
                    ((string *)&(pBVar3->super_BinaryReaderBase).super_ReaderBase.name_);
          bound_reader = (BinaryReader<mp::internal::IdentityConverter> *)0x0;
        }
      }
      else {
        if (bVar1 != 100) goto switchD_001c1808_caseD_44;
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                    *)this);
      }
    }
    else if (bVar1 == 0x6b) {
      ReadColumnSizes<true>(this);
    }
    else if (bVar1 == 0x72) {
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                  *)this);
    }
    else {
      if (bVar1 != 0x78) goto switchD_001c1808_caseD_44;
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                  *)this);
    }
  }
  switch(bVar1) {
  case 0x43:
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons);
    break;
  case 0x44:
  case 0x45:
  case 0x48:
  case 0x49:
  case 0x4d:
  case 0x4e:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x54:
  case 0x55:
    goto switchD_001c1808_caseD_44;
  case 0x46:
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
    uVar8 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
    pBVar3 = this->reader_;
    if (1 < uVar8) {
      local_58 = (undefined1  [16])0x0;
      local_40.types_ = 0;
      local_40.field_1.values_ = (Value *)local_58;
      BinaryReaderBase::ReportError(&pBVar3->super_BinaryReaderBase,(CStringRef)0x2668c3,&local_40);
    }
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ =
         (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
    BinaryReaderBase::Read(&pBVar3->super_BinaryReaderBase,4);
    BinaryReader<mp::internal::IdentityConverter>::ReadString(this->reader_);
    goto LAB_001c17dc;
  case 0x47:
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
    ::
    ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ObjHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                *)this);
    goto LAB_001c17dc;
  case 0x4a:
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
    ::
    ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::AlgebraicConHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                *)this);
    goto LAB_001c17dc;
  case 0x4b:
    ReadColumnSizes<false>(this);
    goto LAB_001c17dc;
  case 0x4c:
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
    ReadLogicalExpr(this);
    goto LAB_001c17dc;
  case 0x4f:
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
    BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
    break;
  case 0x53:
    uVar8 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(pBVar3);
    if (7 < (int)uVar8) {
      local_58 = (undefined1  [16])0x0;
      local_40.types_ = 0;
      local_40.field_1.values_ = (Value *)local_58;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x266ffe,&local_40);
    }
    switch(uVar8 & 3) {
    case 0:
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                  *)this,uVar8);
      break;
    case 1:
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                  *)this,uVar8);
      break;
    case 2:
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ObjHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                  *)this,uVar8);
      break;
    case 3:
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ProblemHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                  *)this,uVar8);
    }
    goto LAB_001c17dc;
  case 0x56:
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
             this->num_vars_and_exprs_);
    iVar9 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
    BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
    if (iVar9 != 0) {
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<BasicTestExpr<0>>,BasicTestExpr<0>>::LinearExprHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                  *)this,iVar9);
    }
    pBVar3 = this->reader_;
    pcVar5 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
    (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
    ReadNumericExpr(this,*pcVar5,false);
    goto LAB_001c17dc;
  default:
    if ((bVar1 == 0) && ((byte *)(pBVar3->super_BinaryReaderBase).super_ReaderBase.end_ == pbVar4))
    {
      if (!bVar10) {
        return;
      }
      local_58 = (undefined1  [16])0x0;
      local_40.types_ = 0;
      local_40.field_1.values_ = (Value *)local_58;
      BinaryReaderBase::ReportError(&pBVar3->super_BinaryReaderBase,(CStringRef)0x263363,&local_40);
    }
    goto switchD_001c1808_caseD_44;
  }
  pBVar3 = this->reader_;
  pcVar5 = (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (pBVar3->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
  (pBVar3->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
  ReadNumericExpr(this,*pcVar5,true);
  goto LAB_001c17dc;
switchD_001c1808_caseD_44:
  local_58 = (undefined1  [16])0x0;
  local_40.types_ = 0;
  local_40.field_1.values_ = (Value *)local_58;
  BinaryReaderBase::ReportError(&pBVar3->super_BinaryReaderBase,(CStringRef)0x26738a,&local_40);
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}